

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::IntField::IntField(IntField *this,int field,int data)

{
  string sStack_38;
  
  IntTConvertor<int>::convert_abi_cxx11_(&sStack_38,(IntTConvertor<int> *)(ulong)(uint)data,data);
  FieldBase::FieldBase(&this->super_FieldBase,field,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001fcc38;
  return;
}

Assistant:

explicit IntField(int field, int data)
      : FieldBase(field, IntConvertor::convert(data)) {}